

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ResourceLeafWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceLeafWrapper *this,size_t fieldId)

{
  size_t fieldId_local;
  ResourceLeafWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"OffsetToData");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"DataSize");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"CodePage");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Reserved");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString ResourceLeafWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case OFFSET_TO_DATA: return "OffsetToData";
        case DATA_SIZE: return "DataSize";
        case CODE_PAGE: return "CodePage";
        case RESERVED: return "Reserved";
    }
    return "";
}